

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O0

void __thiscall ALSAMidiDriver::start(ALSAMidiDriver *this)

{
  int iVar1;
  QDebug *this_00;
  QMessageLogger local_48;
  QDebug local_28;
  int local_1c;
  QObject local_18 [4];
  int error;
  ALSAMidiDriver *local_10;
  ALSAMidiDriver *this_local;
  
  local_10 = this;
  OSSMidiPortDriver::start(&this->rawMidiPortDriver);
  QObject::connect(local_18,(char *)this,
                   (QObject *)"2mainWindowTitleContributionUpdated(const QString &)",
                   (char *)(this->super_MidiDriver).master,0x1cc81d);
  QMetaObject::Connection::~Connection((Connection *)local_18);
  iVar1 = alsa_setup_midi(this);
  if (-1 < iVar1) {
    this->stopProcessing = false;
    local_1c = pthread_create(&this->processingThreadID,(pthread_attr_t *)0x0,processingThread,this)
    ;
    if (local_1c != 0) {
      this->processingThreadID = 0;
      QMessageLogger::QMessageLogger(&local_48,(char *)0x0,0,(char *)0x0);
      QMessageLogger::debug();
      this_00 = QDebug::operator<<(&local_28,"ALSAMidiDriver: Processing Thread creation failed:");
      QDebug::operator<<(this_00,local_1c);
      QDebug::~QDebug(&local_28);
      snd_seq_close(this->snd_seq);
    }
  }
  return;
}

Assistant:

void ALSAMidiDriver::start() {
	rawMidiPortDriver.start();
	connect(this, SIGNAL(mainWindowTitleContributionUpdated(const QString &)), master, SLOT(updateMainWindowTitleContribution(const QString &)));
	if (alsa_setup_midi() < 0) return;
	stopProcessing = false;
	int error = pthread_create(&processingThreadID, NULL, processingThread, this);
	if (error != 0) {
		processingThreadID = 0;
		qDebug() << "ALSAMidiDriver: Processing Thread creation failed:" << error;
		snd_seq_close(snd_seq);
	}
}